

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHCurlProjection.cpp
# Opt level: O2

void __thiscall TPZHCurlProjection<double>::Contribute(TPZHCurlProjection<double> *this)

{
  TPZFMatrix<double> *in_RCX;
  TPZFMatrix<double> *in_RDX;
  TPZMaterialDataT<double> *in_RSI;
  REAL in_XMM0_Qa;
  
  Contribute((TPZHCurlProjection<double> *)&this[-1].fDim,in_RSI,in_XMM0_Qa,in_RDX,in_RCX);
  return;
}

Assistant:

void TPZHCurlProjection<TVar>::Contribute(const TPZMaterialDataT<TVar> &data,
                                       REAL weight,
                                       TPZFMatrix<TVar> &ek, TPZFMatrix<TVar> &ef){
	/*
     * HCurl approximation spaces in NeoPZ are created 
     * from the combination of scalar functions with 
     * constant vector fields
     */
    const auto &phiHCurl = data.phi;
    const auto &curlPhi = data.curlphi;

    //last position of solLoc is the curl
    TPZManVector<TVar,6> solLoc(fDim + fCurlDim);
    if(!this->HasForcingFunction()){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" a forcing function (solution to be projected)\n";
        PZError<<"has not been set! Aborting...\n";
        DebugStop();
    }
    this->fForcingFunction(data.x,solLoc);
    TPZManVector<TVar,3> curlSol(fCurlDim,0.);
    for(int i = 0; i < fCurlDim; i++){curlSol[i] = solLoc[fDim+i];}
    
    const auto nHCurlFunctions = phiHCurl.Rows();
    for (auto iVec = 0; iVec < nHCurlFunctions; iVec++) {
        TVar load = 0.;
        
        for(auto x = 0; x < fDim; x++)
            {load += phiHCurl.GetVal(iVec, x) * solLoc[x];}
        for(auto x = 0; x < fCurlDim; x++)
            {load += curlPhi.GetVal(x, iVec) * curlSol[x];}
        
        ef(iVec,0) += load * weight;
        
        for (auto jVec = 0; jVec < nHCurlFunctions; jVec++) {

            STATE phiIdotPhiJ = 0.;
            for(auto x = 0; x < fDim; x++)
                {phiIdotPhiJ += phiHCurl.GetVal(iVec, x) * phiHCurl.GetVal(jVec, x);}
            STATE curlIcurlJ = 0.;

            for(auto x = 0; x < fCurlDim; x++)
                {curlIcurlJ +=curlPhi.GetVal(x,iVec) * curlPhi.GetVal(x,jVec);}

            ek(iVec, jVec) += (phiIdotPhiJ + curlIcurlJ) * weight;
        }
    }
}